

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

string * cmSystemTools::TrimWhitespace(string *__return_storage_ptr__,string *s)

{
  size_type sVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  char *pcVar5;
  allocator local_29;
  
  pcVar5 = (s->_M_dataplus)._M_p;
  sVar1 = s->_M_string_length;
  sVar3 = sVar1;
  pcVar4 = pcVar5;
  do {
    if (sVar3 == 0) {
LAB_002b5a08:
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
      return __return_storage_ptr__;
    }
    bVar2 = cm_isspace(*pcVar4);
    if (!bVar2) {
      if (sVar3 != 0) {
        pcVar5 = pcVar5 + sVar1 + 1;
        do {
          bVar2 = cm_isspace(pcVar5[-2]);
          pcVar5 = pcVar5 + -1;
        } while (bVar2);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)__return_storage_ptr__,pcVar4,pcVar5);
        return __return_storage_ptr__;
      }
      goto LAB_002b5a08;
    }
    pcVar4 = pcVar4 + 1;
    sVar3 = sVar3 - 1;
  } while( true );
}

Assistant:

std::string cmSystemTools::TrimWhitespace(const std::string& s)
{
  std::string::const_iterator start = s.begin();
  while (start != s.end() && cm_isspace(*start)) {
    ++start;
  }
  if (start == s.end()) {
    return "";
  }
  std::string::const_iterator stop = s.end() - 1;
  while (cm_isspace(*stop)) {
    --stop;
  }
  return std::string(start, stop + 1);
}